

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O2

void __thiscall bandit::reporter::spec::context_starting(spec *this,string *desc)

{
  ostream *poVar1;
  string local_40;
  
  progress_base::context_starting((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  indent_abi_cxx11_(&local_40,this);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<((this->super_colored_base).stm_,"describe ");
  poVar1 = std::operator<<(poVar1,(string *)desc);
  std::endl<char,std::char_traits<char>>(poVar1);
  this->indentation_ = this->indentation_ + 1;
  std::ostream::flush();
  return;
}

Assistant:

void context_starting(const std::string& desc) override {
        progress_base::context_starting(desc);

        stm_ << indent();
        stm_ << "describe " << desc << std::endl;
        increase_indent();
        stm_.flush();
      }